

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCompositeInsert(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  Op OVar2;
  uint32_t id;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_5d8;
  char *local_400;
  char *local_3f8;
  DiagnosticStream local_3f0;
  spv_result_t local_218;
  uint32_t local_214;
  spv_result_t error;
  uint32_t member_type;
  DiagnosticStream local_208;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t result_type;
  uint32_t composite_type;
  uint32_t object_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _composite_type = inst;
  inst_local = (Instruction *)_;
  result_type = ValidationState_t::GetOperandTypeId(_,inst,2);
  local_28 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_composite_type,3);
  local_2c = val::Instruction::type_id(_composite_type);
  if (local_2c == local_28) {
    local_214 = 0;
    local_218 = GetExtractInsertValueType
                          ((ValidationState_t *)inst_local,_composite_type,&local_214);
    __local._4_4_ = local_218;
    if (local_218 == SPV_SUCCESS) {
      if (result_type == local_214) {
        bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
        this = inst_local;
        if (bVar1) {
          id = val::Instruction::type_id(_composite_type);
          bVar1 = ValidationState_t::ContainsLimitedUseIntOrFloatType((ValidationState_t *)this,id);
          if (bVar1) {
            ValidationState_t::diag
                      (&local_5d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _composite_type);
            pDVar3 = DiagnosticStream::operator<<
                               (&local_5d8,
                                (char (*) [53])
                                "Cannot insert into a composite of 8- or 16-bit types");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
            DiagnosticStream::~DiagnosticStream(&local_5d8);
            return __local._4_4_;
          }
        }
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  (&local_3f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_composite_type
                  );
        pDVar3 = DiagnosticStream::operator<<(&local_3f0,(char (*) [20])"The Object type (Op");
        OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,result_type);
        local_3f8 = spvOpcodeString(OVar2);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_3f8);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [76])
                                   ") does not match the type that results from indexing into the Composite (Op"
                           );
        OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_214);
        local_400 = spvOpcodeString(OVar2);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_400);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0xf65ced);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        DiagnosticStream::~DiagnosticStream(&local_3f0);
      }
    }
  }
  else {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_composite_type);
    pDVar3 = DiagnosticStream::operator<<
                       (&local_208,
                        (char (*) [57])"The Result Type must be the same as Composite type in Op");
    OVar2 = val::Instruction::opcode(_composite_type);
    _error = spvOpcodeString(OVar2);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char **)&error);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [21])" yielding Result Id ");
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_2c);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0xf544de);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCompositeInsert(ValidationState_t& _,
                                     const Instruction* inst) {
  const uint32_t object_type = _.GetOperandTypeId(inst, 2);
  const uint32_t composite_type = _.GetOperandTypeId(inst, 3);
  const uint32_t result_type = inst->type_id();
  if (result_type != composite_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The Result Type must be the same as Composite type in Op"
           << spvOpcodeString(inst->opcode()) << " yielding Result Id "
           << result_type << ".";
  }

  uint32_t member_type = 0;
  if (spv_result_t error = GetExtractInsertValueType(_, inst, &member_type)) {
    return error;
  }

  if (object_type != member_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The Object type (Op"
           << spvOpcodeString(_.GetIdOpcode(object_type))
           << ") does not match the type that results from indexing into the "
              "Composite (Op"
           << spvOpcodeString(_.GetIdOpcode(member_type)) << ").";
  }

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Cannot insert into a composite of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}